

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O0

bool __thiscall QJsonObject::contains(QJsonObject *this,QLatin1StringView key)

{
  long lVar1;
  QLatin1String key_00;
  bool bVar2;
  QJsonObject *in_RSI;
  long in_FS_OFFSET;
  qsizetype unaff_retaddr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key_00.m_data = (char *)this;
  key_00.m_size = unaff_retaddr;
  bVar2 = containsImpl<QLatin1String>(in_RSI,key_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QJsonObject::contains(QLatin1StringView key) const
{
    return containsImpl(key);
}